

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

String * __thiscall indigox::Atom::GetName_abi_cxx11_(String *__return_storage_ptr__,Atom *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

String Atom::GetName() const { return name_; }